

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Firework.cpp
# Opt level: O3

void __thiscall Firework::displayFireworkExplosion(Firework *this,Screen *screen)

{
  pointer *text;
  pointer pcVar1;
  size_type sVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  int iVar6;
  pointer pbVar7;
  Screen *pSVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  undefined1 *puVar17;
  undefined1 *puVar18;
  ulong uVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  ulong uVar23;
  long lVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined8 uStack_b0;
  undefined1 auStack_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  image;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Screen *local_60;
  ulong local_58;
  ulong local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_80.field_2._8_8_ = auStack_a8;
  auStack_a8 = (undefined1  [8])0x0;
  image.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  image.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar23 = (ulong)(uint)this->explosionDiameter;
  local_40 = (double)CONCAT44(local_40._4_4_,this->explosionDiameter / 2);
  local_50 = (ulong)(uint)this->endPosition[0];
  local_58 = (ulong)(uint)this->endPosition[1];
  lVar5 = -(uVar23 * uVar23 + 0xf & 0xfffffffffffffff0);
  puVar17 = auStack_a8 + lVar5;
  sVar12 = (size_t)this->explosionDiameter;
  puVar18 = puVar17;
  uVar9 = auStack_a8;
  local_60 = screen;
  local_38 = (double)sVar12;
  if (0 < (long)sVar12) {
    do {
      local_80.field_2._8_8_ = uVar9;
      dVar16 = local_38;
      *(undefined8 *)((long)&uStack_b0 + lVar5) = 0x11e551;
      memset(puVar18,0,(size_t)dVar16);
      sVar12 = sVar12 - 1;
      puVar18 = puVar18 + uVar23;
      uVar9 = local_80.field_2._8_8_;
    } while (sVar12 != 0);
  }
  iVar6 = local_40._0_4_;
  local_50 = (ulong)(uint)((int)local_50 - local_40._0_4_);
  local_48 = (double)((int)(((uint)((ulong)local_38 >> 0x1f) & 1) + SUB84(local_38,0)) >> 1);
  dVar16 = 0.0;
  do {
    local_40 = (double)(this->explosionDiameter / 2);
    local_38 = dVar16;
    *(undefined8 *)((long)&uStack_b0 + lVar5) = 0x11e5b6;
    dVar16 = cos(dVar16);
    dVar4 = local_38;
    dVar3 = dVar16 * local_40 + local_48;
    local_40 = (double)(this->explosionDiameter / 2);
    *(undefined8 *)((long)&uStack_b0 + lVar5) = 0x11e5eb;
    dVar4 = sin(dVar4);
    dVar16 = local_38;
    puVar17[(long)(int)dVar3 + (long)(int)(dVar4 * local_40 + local_48) * uVar23] = 1;
    dVar16 = dVar16 + 0.008726646259972222;
  } while (dVar16 <= 6.28318530718);
  iVar10 = this->explosionDiameter;
  uVar13 = (ulong)iVar10;
  if (0 < (long)uVar13) {
    uVar15 = 0;
    bVar22 = 0;
    puVar18 = puVar17;
    do {
      uVar19 = 0;
      bVar20 = bVar22;
      do {
        bVar21 = puVar18[uVar19] ^ 1;
        if (((((bVar21 != 0) || (uVar15 == 0)) || (bVar20 != 0)) ||
            (bVar22 = 1, uVar15 == iVar10 - 1)) &&
           ((bVar22 = bVar21 & bVar20, puVar18[uVar19] == 0 && (bVar20 == 1)))) {
          puVar18[uVar19] = 1;
          bVar22 = bVar20;
        }
        uVar19 = uVar19 + 1;
        bVar20 = bVar22;
      } while (uVar13 != uVar19);
      uVar15 = uVar15 + 1;
      puVar18 = puVar18 + uVar23;
    } while (uVar15 != uVar13);
  }
  pSVar8 = local_60;
  uVar11 = this->explosionColor;
  *(undefined8 *)((long)&uStack_b0 + lVar5) = 0x11e6b1;
  Screen::turnAttrOn(pSVar8,(uVar11 & 0xff) << 8);
  dVar16 = this->explosionFrameCounter;
  uVar25 = SUB84(dVar16,0);
  uVar26 = (undefined4)((ulong)dVar16 >> 0x20);
  if (1.5 <= dVar16) {
    this->fireworkStage = 4;
  }
  else {
    iVar10 = this->explosionDiameter;
    if (0 < iVar10) {
      local_58 = (ulong)(uint)((int)local_58 - iVar6);
      dVar16 = 0.0;
      text = &image.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_80.field_2._M_allocated_capacity = uVar23;
      do {
        local_48 = dVar16;
        if (iVar10 < 1) {
          lVar14 = (long)iVar10;
        }
        else {
          local_38 = (double)CONCAT44(local_38._4_4_,(int)local_50 + SUB84(dVar16,0));
          lVar24 = 0;
          do {
            if (puVar17[lVar24] == '\x01') {
              *(undefined8 *)((long)&uStack_b0 + lVar5) = 0x11e71a;
              uVar11 = rand();
              if ((uVar11 & 1) != 0) {
                image.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_80;
                pcVar1 = (this->explosionParticle)._M_dataplus._M_p;
                sVar2 = (this->explosionParticle)._M_string_length;
                *(undefined8 *)((long)&uStack_b0 + lVar5) = 0x11e73c;
                std::__cxx11::string::_M_construct<char*>((string *)text,pcVar1,pcVar1 + sVar2);
                pSVar8 = local_60;
                iVar6 = (int)local_58;
                iVar10 = local_38._0_4_;
                *(undefined8 *)((long)&uStack_b0 + lVar5) = 0x11e753;
                Screen::printString(pSVar8,(string *)text,iVar10,iVar6 + (int)lVar24);
                pbVar7 = image.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                if (image.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != &local_80) {
                  *(undefined8 *)((long)&uStack_b0 + lVar5) = 0x11e76b;
                  operator_delete(pbVar7);
                }
              }
            }
            lVar24 = lVar24 + 1;
            iVar10 = this->explosionDiameter;
            lVar14 = (long)iVar10;
          } while (lVar24 < lVar14);
        }
        dVar16 = (double)((long)local_48 + 1);
        puVar17 = puVar17 + local_80.field_2._M_allocated_capacity;
      } while ((long)dVar16 < lVar14);
      uVar25 = SUB84(this->explosionFrameCounter,0);
      uVar26 = (undefined4)((ulong)this->explosionFrameCounter >> 0x20);
    }
    this->explosionFrameCounter = (double)CONCAT44(uVar26,uVar25) + 0.125;
  }
  pSVar8 = local_60;
  uVar11 = this->explosionColor;
  *(undefined8 *)((long)&uStack_b0 + lVar5) = 0x11e7d9;
  Screen::turnAttrOff(pSVar8,(uVar11 & 0xff) << 8);
  *(undefined8 *)(local_80.field_2._8_8_ + -8) = 0x11e7e9;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_a8);
  return;
}

Assistant:

void Firework::displayFireworkExplosion(Screen &screen) {
    double explosionCycleFrames = 3;      /* The number of frames to display the explosion circle                 */
    double explosionTotalTime = 1.5;         /* The total time, in seconds, to display the explosion circle          */

    std::vector<std::string> image;
    double i;
    int j, k;


    // Calculate the start coordinates for printing the 2d string array
    int startCursorPosition[2];
    startCursorPosition[0] = endPosition[0] - (explosionDiameter / 2);
    startCursorPosition[1] = endPosition[1] - (explosionDiameter / 2);

    // Generate the image boundaries
    bool boundaries[explosionDiameter][explosionDiameter];
    for (j = 0; j < explosionDiameter; j++){
        for(k = 0; k < explosionDiameter; k++){
            boundaries[j][k] = false;
        }
    }

    int x, y;
    const int cx = explosionDiameter / 2;
    const int cy = explosionDiameter / 2;
    for(i = 0; i <= (2 * PI); i+= (PI / 360) ){
        // Calculate a point on the edge of the circle
        x = (int)( cx + (explosionDiameter / 2) * cos(i) );
        y = (int)( cy + (explosionDiameter / 2) * sin(i) );

        // Store that point in the boundary array
        boundaries[y][x] = true;
    }

    // Fill in the boundary circle

    bool flag = false;
    for (j = 0; j < explosionDiameter; j++){
        for(k = 0; k < explosionDiameter; k++){
            if(boundaries[j][k] && !flag && j != 0 && j != (explosionDiameter - 1)){
                // Turn on the filling property
                flag = true;
            }
            else if(boundaries[j][k] && flag){
                // The other edge of the boundary circle has been reached
                flag = false;
            }
            else if(flag){
                boundaries[j][k] = true;
            }
        }
    }


    // Generate the image


    // Print the image
    screen.turnAttrOn(COLOR_PAIR(explosionColor));


    if(explosionFrameCounter < explosionTotalTime){
        for (j = 0; j < explosionDiameter; j++){
            for(k = 0; k < explosionDiameter; k++){
                if(boundaries[j][k]){
                    if(rand() % 2){
                        screen.printString(explosionParticle, startCursorPosition[0] + j, startCursorPosition[1] + k);
                    }
                }
            }
        }
        explosionFrameCounter += (explosionCycleFrames / FRAMES_PER_SECOND);
    }
    else{
        fireworkStage = FINISHED;
    }

    screen.turnAttrOff(COLOR_PAIR(explosionColor));
}